

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O1

MPP_RET vepu541_set_osd(Vepu541OsdCfg *cfg)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  void *pvVar3;
  MppDev ctx;
  MppEncOSDPltCfg *pMVar4;
  MPP_RET MVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  MppBuffer *ppvVar9;
  MPP_RET MVar10;
  ulong uVar11;
  MppDevRegWrCfg wr_cfg;
  MppEncOSDData2 osd;
  
  pvVar3 = cfg->reg_base;
  ctx = cfg->dev;
  pMVar4 = cfg->plt_cfg;
  MVar5 = copy2osd2(&osd,cfg->osd_data,cfg->osd_data2);
  MVar10 = MPP_NOK;
  if (MVar5 == MPP_OK) {
    if (osd.num_region == 0) {
      MVar10 = MPP_OK;
    }
    else if (osd.num_region < 9) {
      if (pMVar4->type == MPP_ENC_OSD_PLT_TYPE_USERDEF) {
        wr_cfg.reg = pMVar4->plt;
        wr_cfg.size = 0x400;
        wr_cfg.offset = 0x400;
        mpp_dev_ioctl(ctx,4,&wr_cfg);
        uVar6 = *(uint *)((long)pvVar3 + 0x1c0) & 0xfffcffff | 0x10000;
      }
      else {
        uVar6 = *(uint *)((long)pvVar3 + 0x1c0) & 0xfffcffff | 0x20000;
      }
      *(uint *)((long)pvVar3 + 0x1c0) = uVar6;
      *(uint *)((long)pvVar3 + 0x1c0) = (uint)*(ushort *)((long)pvVar3 + 0x1c2) << 0x10;
      ppvVar9 = &osd.region[0].buf;
      uVar11 = 0;
      do {
        RVar1 = ((MppEncOSDRegion2 *)(ppvVar9 + -4))->enable;
        uVar6 = *(uint *)((long)pvVar3 + 0x1c0);
        uVar8 = RVar1 << ((byte)uVar11 & 0x1f) & 0xff;
        *(uint *)((long)pvVar3 + 0x1c0) = uVar8 | uVar6;
        *(uint *)((long)pvVar3 + 0x1c0) =
             uVar8 | uVar6 & 0xffff00ff |
             ((*(RK_U32 *)((long)ppvVar9 + -0x1c) << ((byte)uVar11 & 0x1f)) << 8 | uVar6) & 0xff00;
        if (((RVar1 != 0) && (RVar1 = *(RK_U32 *)(ppvVar9 + -2), RVar1 != 0)) &&
           (RVar2 = *(RK_U32 *)((long)ppvVar9 + -0xc), RVar2 != 0)) {
          uVar6 = *(uint *)(ppvVar9 + -3);
          *(char *)((long)pvVar3 + uVar11 * 4 + 0x1d0) = (char)uVar6;
          *(uint *)((long)pvVar3 + uVar11 * 4 + 0x1d0) =
               ((uVar6 + RVar1) * 0x10000 + 0xff0000 & 0xff0000 |
                (*(RK_U32 *)((long)ppvVar9 + -0x14) & 0xff) << 8 |
               (*(RK_U32 *)((long)ppvVar9 + -0x14) + RVar2) * 0x1000000) + (uVar6 & 0xff) +
               -0x1000000;
          sVar7 = mpp_buffer_get_size_with_caller(*ppvVar9,"vepu541_set_osd");
          uVar6 = mpp_buffer_get_fd_with_caller(*ppvVar9,"vepu541_set_osd");
          if ((int)uVar6 < 0) {
            _mpp_log_l(2,"vepu541_common","invalid osd buffer fd %d\n","vepu541_set_osd",
                       (ulong)uVar6);
          }
          else {
            *(uint *)((long)pvVar3 + uVar11 * 4 + 0x1f0) = uVar6;
            if (*(RK_U32 *)(ppvVar9 + -1) != 0) {
              mpp_dev_set_reg_offset(ctx,(int)uVar11 + 0x7c,*(RK_U32 *)(ppvVar9 + -1));
            }
            uVar8 = *(uint *)(ppvVar9 + -1);
            if (((uVar8 & 0xf) != 0) ||
               ((sVar7 & 0xffffffff) < (ulong)uVar8 + (ulong)(RVar1 * RVar2 * 0x100))) {
              _mpp_log_l(2,"vepu541_common","invalid osd cfg: %d x:y:w:h:off %d:%d:%d:%d:%x\n",
                         "vepu541_set_osd",uVar11 & 0xffffffff,(ulong)*(uint *)(ppvVar9 + -3),
                         (ulong)*(RK_U32 *)((long)ppvVar9 + -0x14),(ulong)*(uint *)(ppvVar9 + -2),
                         (ulong)*(RK_U32 *)((long)ppvVar9 + -0xc),(ulong)uVar8);
            }
          }
          if ((int)uVar6 < 0) {
            return MPP_NOK;
          }
        }
        uVar11 = uVar11 + 1;
        ppvVar9 = ppvVar9 + 5;
      } while (osd.num_region + (osd.num_region == 0) != uVar11);
      if (osd.region[0].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c4) = *(byte *)((long)pvVar3 + 0x1c4) | 0xf;
      }
      if (osd.region[1].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c4) = *(byte *)((long)pvVar3 + 0x1c4) | 0xf0;
      }
      if (osd.region[2].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c5) = *(byte *)((long)pvVar3 + 0x1c5) | 0xf;
      }
      if (osd.region[3].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c5) = *(byte *)((long)pvVar3 + 0x1c5) | 0xf0;
      }
      if (osd.region[4].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c6) = *(byte *)((long)pvVar3 + 0x1c6) | 0xf;
      }
      if (osd.region[5].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c6) = *(byte *)((long)pvVar3 + 0x1c6) | 0xf0;
      }
      if (osd.region[6].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c7) = *(byte *)((long)pvVar3 + 0x1c7) | 0xf;
      }
      MVar10 = MPP_OK;
      if (osd.region[7].inverse != 0) {
        *(byte *)((long)pvVar3 + 0x1c7) = *(byte *)((long)pvVar3 + 0x1c7) | 0xf0;
        MVar10 = MPP_OK;
      }
    }
    else {
      _mpp_log_l(2,"vepu541_common","do NOT support more than 8 regions invalid num %d\n",
                 "vepu541_set_osd",(ulong)osd.num_region);
      _mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "osd.num_region <= 8","vepu541_set_osd",0x265);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
  }
  return MVar10;
}

Assistant:

MPP_RET vepu541_set_osd(Vepu541OsdCfg *cfg)
{
    Vepu541OsdReg *regs = (Vepu541OsdReg *)(cfg->reg_base + (size_t)VEPU541_OSD_CFG_OFFSET);
    MppDev dev = cfg->dev;
    MppEncOSDPltCfg *plt_cfg = cfg->plt_cfg;
    MppEncOSDData2 osd;

    if (copy2osd2(&osd, cfg->osd_data, cfg->osd_data2))
        return MPP_NOK;

    if (osd.num_region == 0)
        return MPP_OK;

    if (osd.num_region > 8) {
        mpp_err_f("do NOT support more than 8 regions invalid num %d\n",
                  osd.num_region);
        mpp_assert(osd.num_region <= 8);
        return MPP_NOK;
    }

    if (plt_cfg->type == MPP_ENC_OSD_PLT_TYPE_USERDEF) {
        MppDevRegWrCfg wr_cfg;

        wr_cfg.reg = plt_cfg->plt;
        wr_cfg.size = sizeof(MppEncOSDPlt);
        wr_cfg.offset = VEPU541_REG_BASE_OSD_PLT;

        mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        regs->reg112.osd_plt_cks = 1;
        regs->reg112.osd_plt_typ = VEPU541_OSD_PLT_TYPE_USERDEF;
    } else {
        regs->reg112.osd_plt_cks = 0;
        regs->reg112.osd_plt_typ = VEPU541_OSD_PLT_TYPE_DEFAULT;
    }

    regs->reg112.osd_e = 0;
    regs->reg112.osd_inv_e = 0;

    RK_U32 i = 0;
    MppEncOSDRegion2 *region = osd.region;
    MppEncOSDRegion2 *tmp = region;
    RK_U32 num = osd.num_region;

    for (i = 0; i < num; i++, tmp++) {
        regs->reg112.osd_e      |= tmp->enable << i;
        regs->reg112.osd_inv_e  |= tmp->inverse << i;

        if (tmp->enable && tmp->num_mb_x && tmp->num_mb_y) {
            Vepu541OsdPos *pos = &regs->osd_pos[i];
            size_t blk_len = tmp->num_mb_x * tmp->num_mb_y * 256;
            RK_S32 fd = 0;
            RK_U32 buf_size = 0;

            pos->osd_lt_x = tmp->start_mb_x;
            pos->osd_lt_y = tmp->start_mb_y;
            pos->osd_rb_x = tmp->start_mb_x + tmp->num_mb_x - 1;
            pos->osd_rb_y = tmp->start_mb_y + tmp->num_mb_y - 1;

            buf_size = mpp_buffer_get_size(tmp->buf);
            fd = mpp_buffer_get_fd(tmp->buf);
            if (fd < 0) {
                mpp_err_f("invalid osd buffer fd %d\n", fd);
                return MPP_NOK;
            }
            regs->osd_addr[i] = fd;

            if (tmp->buf_offset)
                mpp_dev_set_reg_offset(dev, VEPU541_OSD_ADDR_IDX_BASE + i, tmp->buf_offset);

            /* There should be enough buffer and offset should be 16B aligned */
            if (buf_size < tmp->buf_offset + blk_len ||
                (tmp->buf_offset & 0xf)) {
                mpp_err_f("invalid osd cfg: %d x:y:w:h:off %d:%d:%d:%d:%x\n",
                          i, tmp->start_mb_x, tmp->start_mb_y,
                          tmp->num_mb_x, tmp->num_mb_y, tmp->buf_offset);
            }
        }
    }

    SET_OSD_INV_THR(0, regs->reg113, region);
    SET_OSD_INV_THR(1, regs->reg113, region);
    SET_OSD_INV_THR(2, regs->reg113, region);
    SET_OSD_INV_THR(3, regs->reg113, region);
    SET_OSD_INV_THR(4, regs->reg113, region);
    SET_OSD_INV_THR(5, regs->reg113, region);
    SET_OSD_INV_THR(6, regs->reg113, region);
    SET_OSD_INV_THR(7, regs->reg113, region);

    return MPP_OK;
}